

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

IndirOpnd * __thiscall
Lowerer::GenerateFastElemISymbolIndexCommon
          (Lowerer *this,Instr *elemInstr,bool isStore,IndirOpnd *indirOpnd,LabelInstr *labelHelper,
          FldInfoFlags flags)

{
  code *pcVar1;
  bool bVar2;
  uint32 hitRateOffset_00;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  uint32 local_64;
  uint32 hitRateOffset;
  uint32 inlineCacheOffset;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  LabelInstr *pLStack_30;
  FldInfoFlags flags_local;
  LabelInstr *labelHelper_local;
  IndirOpnd *indirOpnd_local;
  Instr *pIStack_18;
  bool isStore_local;
  Instr *elemInstr_local;
  Lowerer *this_local;
  
  indexOpnd._7_1_ = flags;
  pLStack_30 = labelHelper;
  labelHelper_local = (LabelInstr *)indirOpnd;
  indirOpnd_local._7_1_ = isStore;
  pIStack_18 = elemInstr;
  elemInstr_local = (Instr *)this;
  baseOpnd = IR::IndirOpnd::GetIndexOpnd(indirOpnd);
  _inlineCacheOffset = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)labelHelper_local);
  if (_inlineCacheOffset == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x40a1,"(baseOpnd != nullptr)","baseOpnd != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  hitRateOffset._2_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&baseOpnd->super_Opnd);
  bVar2 = ValueType::IsLikelySymbol((ValueType *)((long)&hitRateOffset + 2));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x40a2,"(indexOpnd->GetValueType().IsLikelySymbol())",
                       "indexOpnd->GetValueType().IsLikelySymbol()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  GenerateSymbolTest(this,baseOpnd,pIStack_18,pLStack_30,(LabelInstr *)0x0,true);
  if ((indirOpnd_local._7_1_ & 1) == 0) {
    local_64 = Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
  }
  else {
    local_64 = Js::JavascriptSymbol::GetOffsetOfStElemInlineCache();
  }
  hitRateOffset_00 = Js::JavascriptSymbol::GetOffsetOfHitRate();
  pIVar4 = GenerateFastElemISymbolOrStringIndexCommon
                     (this,pIStack_18,baseOpnd,_inlineCacheOffset,local_64,hitRateOffset_00,
                      pLStack_30,indexOpnd._7_1_);
  return pIVar4;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemISymbolIndexCommon(
    _In_ IR::Instr* elemInstr,
    _In_ bool isStore,
    _In_ IR::IndirOpnd* indirOpnd,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    Assert(baseOpnd != nullptr);
    Assert(indexOpnd->GetValueType().IsLikelySymbol());

    // Generates:
    //      SymbolTest(indexOpnd, $helper)                ; verify index is symbol type
    //      FastElemISymbolOrStringIndexCommon(indexOpnd, baseOpnd, $helper) ; shared code with PropertyString

    GenerateSymbolTest(indexOpnd, elemInstr, labelHelper);

    const uint32 inlineCacheOffset = isStore ? Js::JavascriptSymbol::GetOffsetOfStElemInlineCache() : Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
    const uint32 hitRateOffset = Js::JavascriptSymbol::GetOffsetOfHitRate();

    return GenerateFastElemISymbolOrStringIndexCommon(elemInstr, indexOpnd, baseOpnd, inlineCacheOffset, hitRateOffset, labelHelper, flags);
}